

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O3

void __thiscall phosg::JSON::JSON(JSON *this,string *x)

{
  pointer pcVar1;
  
  *(undefined1 **)
   &(this->value).
    super__Variant_base<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
    .
    super__Move_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
    .
    super__Copy_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
    .
    super__Move_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
    .
    super__Copy_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
    .
    super__Variant_storage_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
       = (undefined1 *)
         ((long)&(this->value).
                 super__Variant_base<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                 .
                 super__Move_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                 .
                 super__Copy_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                 .
                 super__Move_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                 .
                 super__Copy_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                 .
                 super__Variant_storage_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
         + 0x10);
  pcVar1 = (x->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + x->_M_string_length);
  *(__index_type *)
   ((long)&(this->value).
           super__Variant_base<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
           .
           super__Move_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
           .
           super__Copy_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
           .
           super__Move_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
           .
           super__Copy_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
           .
           super__Variant_storage_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
   + 0x38) = '\x04';
  return;
}

Assistant:

JSON::JSON(const string& x) : value(x) {}